

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMTypeRef
CompileLlvmFunctionType
          (LlvmCompilationContext *ctx,TypeBase *returnType,ArrayView<TypeBase_*> argumentTypes)

{
  LLVMTypeRef pLVar1;
  ulong uVar2;
  ulong uVar3;
  SmallArray<LLVMTypeRefOpaque_*,_32U> arguments;
  SmallArray<LLVMTypeRefOpaque_*,_32U> local_148;
  
  local_148.allocator = ctx->allocator;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  if (argumentTypes.count != 0) {
    uVar3 = 0;
    do {
      pLVar1 = CompileLlvmType(ctx,argumentTypes.data[uVar3]);
      if (local_148.count == local_148.max) {
        SmallArray<LLVMTypeRefOpaque_*,_32U>::grow(&local_148,local_148.count);
      }
      if (local_148.data == (LLVMTypeRefOpaque **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<LLVMTypeRefOpaque *, 32>::push_back(const T &) [T = LLVMTypeRefOpaque *, N = 32]"
                     );
      }
      uVar2 = (ulong)local_148.count;
      local_148.count = local_148.count + 1;
      local_148.data[uVar2] = pLVar1;
      uVar3 = uVar3 + 1;
    } while (argumentTypes.count != uVar3);
  }
  CompileLlvmType(ctx,returnType);
  SmallArray<LLVMTypeRefOpaque_*,_32U>::~SmallArray(&local_148);
  return (LLVMTypeRef)&placeholderType;
}

Assistant:

LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext& ctx, TypeBase *returnType, ArrayView<TypeBase*> argumentTypes)
{
	bool isStructReturnType = IsStructReturnType(returnType);

	SmallArray<LLVMTypeRef, 32> arguments(ctx.allocator);

	if (isStructReturnType)
	{
		TypeBase* newType = ctx.ctx.GetReferenceType(returnType);

		if (newType->typeIndex == ~0u)
		{
			assert(newType == ctx.ctx.types.back());

			ctx.ctx.types.back()->typeIndex = ctx.ctx.types.size() - 1;
			ctx.types.push_back(NULL);
		}

		arguments.push_back(CompileLlvmType(ctx, newType));
	}

	for (unsigned i = 0; i < argumentTypes.size(); i++)
	{
		TypeBase* argumentType = argumentTypes[i];

		if (IsStructArgumentType(argumentType))
		{
			TypeBase* newType = ctx.ctx.GetReferenceType(argumentType);

			if (newType->typeIndex == ~0u)
			{
				assert(newType == ctx.ctx.types.back());

				ctx.ctx.types.back()->typeIndex = ctx.ctx.types.size() - 1;
				ctx.types.push_back(NULL);
			}

			arguments.push_back(CompileLlvmType(ctx, newType));
		}
		else
		{
			arguments.push_back(CompileLlvmType(ctx, argumentType));
		}
	}

	LLVMTypeRef resultType = isStructReturnType ? LLVMVoidTypeInContext(ctx.context) : CompileLlvmType(ctx, returnType);

	return LLVMFunctionType(resultType, arguments.data, arguments.count, false);
}